

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_reader.c
# Opt level: O2

char * lafe_line_reader_next(lafe_line_reader *lr)

{
  char *__ptr;
  size_t sVar1;
  FILE *__stream;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  int *piVar6;
  long lVar7;
  
  do {
    while( true ) {
      pcVar4 = lr->buff_end;
      if (pcVar4 <= lr->line_end) break;
      pcVar4 = lr->line_start;
      pcVar3 = lr->line_end + 1;
      lr->line_end = pcVar3;
      lr->line_start = pcVar3;
      lafe_line_reader_find_eol(lr);
      if (lr->nullSeparator != 0) {
        return pcVar4;
      }
      if (*pcVar4 != '\0') {
        return pcVar4;
      }
    }
    pcVar3 = lr->line_start;
    if (lr->f == (FILE *)0x0) {
      if (pcVar3 == pcVar4) {
        pcVar3 = (char *)0x0;
      }
      else {
        lr->line_start = pcVar4;
      }
      return pcVar3;
    }
    __ptr = lr->buff;
    if (pcVar3 <= __ptr) {
      sVar1 = lr->buff_length;
      if (0 < (long)sVar1) {
        lr->buff_length = sVar1 * 2;
        pcVar4 = (char *)realloc(__ptr,sVar1 * 2 + 1);
        if (pcVar4 != (char *)0x0) {
          pcVar3 = pcVar4 + ((long)lr->buff_end - (long)lr->buff);
          lr->buff_end = pcVar3;
          lr->line_end = pcVar4 + ((long)lr->line_end - (long)lr->buff);
          lr->buff = pcVar4;
          goto LAB_0010b9fb;
        }
      }
      pcVar4 = lr->pathname;
      pcVar3 = "Line too long in %s";
      iVar2 = 0xc;
LAB_0010baa7:
      lafe_errc(1,iVar2,pcVar3,pcVar4);
    }
    memmove(__ptr,pcVar3,(long)pcVar4 - (long)pcVar3);
    pcVar4 = lr->buff;
    lVar7 = (long)pcVar4 - (long)lr->line_start;
    pcVar3 = lr->buff_end + lVar7;
    lr->buff_end = pcVar3;
    lr->line_end = lr->line_end + lVar7;
LAB_0010b9fb:
    lr->line_start = pcVar4;
    sVar5 = fread(pcVar3,1,(size_t)(pcVar4 + (lr->buff_length - (long)pcVar3)),(FILE *)lr->f);
    pcVar4 = lr->buff_end;
    lr->buff_end = pcVar4 + sVar5;
    pcVar4[sVar5] = '\0';
    lafe_line_reader_find_eol(lr);
    __stream = (FILE *)lr->f;
    iVar2 = ferror(__stream);
    if (iVar2 != 0) {
      piVar6 = __errno_location();
      iVar2 = *piVar6;
      pcVar4 = lr->pathname;
      pcVar3 = "Can\'t read %s";
      goto LAB_0010baa7;
    }
    iVar2 = feof(__stream);
    if (iVar2 != 0) {
      if ((FILE *)lr->f != _stdin) {
        fclose((FILE *)lr->f);
      }
      lr->f = (FILE *)0x0;
    }
  } while( true );
}

Assistant:

const char *
lafe_line_reader_next(struct lafe_line_reader *lr)
{
	size_t bytes_wanted, bytes_read, new_buff_size;
	char *line_start, *p;

	for (;;) {
		/* If there's a line in the buffer, return it immediately. */
		while (lr->line_end < lr->buff_end) {
			line_start = lr->line_start;
			lr->line_start = ++lr->line_end;
			lafe_line_reader_find_eol(lr);

			if (lr->nullSeparator || line_start[0] != '\0')
				return (line_start);
		}

		/* If we're at end-of-file, process the final data. */
		if (lr->f == NULL) {
			if (lr->line_start == lr->buff_end)
				return (NULL); /* No more text */
			line_start = lr->line_start;
			lr->line_start = lr->buff_end;
			return (line_start);
		}

		/* Buffer only has part of a line. */
		if (lr->line_start > lr->buff) {
			/* Move a leftover fractional line to the beginning. */
			memmove(lr->buff, lr->line_start,
			    lr->buff_end - lr->line_start);
			lr->buff_end -= lr->line_start - lr->buff;
			lr->line_end -= lr->line_start - lr->buff;
			lr->line_start = lr->buff;
		} else {
			/* Line is too big; enlarge the buffer. */
			new_buff_size = lr->buff_length * 2;
			if (new_buff_size <= lr->buff_length)
				lafe_errc(1, ENOMEM,
				    "Line too long in %s", lr->pathname);
			lr->buff_length = new_buff_size;
			/*
			 * Allocate one extra byte to allow terminating
			 * the buffer.
			 */
			p = realloc(lr->buff, new_buff_size + 1);
			if (p == NULL)
				lafe_errc(1, ENOMEM,
				    "Line too long in %s", lr->pathname);
			lr->buff_end = p + (lr->buff_end - lr->buff);
			lr->line_end = p + (lr->line_end - lr->buff);
			lr->line_start = lr->buff = p;
		}

		/* Get some more data into the buffer. */
		bytes_wanted = lr->buff + lr->buff_length - lr->buff_end;
		bytes_read = fread(lr->buff_end, 1, bytes_wanted, lr->f);
		lr->buff_end += bytes_read;
		*lr->buff_end = '\0'; /* Always terminate buffer */
		lafe_line_reader_find_eol(lr);

		if (ferror(lr->f))
			lafe_errc(1, errno, "Can't read %s", lr->pathname);
		if (feof(lr->f)) {
			if (lr->f != stdin)
				fclose(lr->f);
			lr->f = NULL;
		}
	}
}